

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_meta___call(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  CTState *cts;
  int iVar3;
  GCcdata *cd;
  cTValue *tv;
  GCstr *pGVar4;
  MMS mm;
  int in_ESI;
  uint id;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  cd = ffi_checkcdata(L,in_ESI);
  uVar1 = cd->ctypeid;
  id = (uint)uVar1;
  if (id == 0x16) {
    id = (uint)cd[1].nextgc.gcptr64;
    mm = MM_new;
  }
  else {
    iVar3 = lj_ccall_func(L,cd);
    if (-1 < iVar3) {
      return iVar3;
    }
    mm = MM_call;
  }
  uVar2 = cts->tab[id].info;
  if ((uVar2 & 0xf0000000) == 0x20000000) {
    id = uVar2 & 0xffff;
  }
  tv = lj_ctype_meta(cts,id,mm);
  if (tv == (cTValue *)0x0) {
    if (uVar1 == 0x16) {
      lj_cf_ffi_new(L);
      return 1;
    }
    pGVar4 = lj_ctype_repr(L,id,(GCstr *)0x0);
    lj_err_callerv(L,LJ_ERR_FFI_BADCALL,pGVar4 + 1);
  }
  iVar3 = lj_meta_tailcall(L,tv);
  return iVar3;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}